

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdir.cpp
# Opt level: O2

QStringList *
QDirPrivate::splitFilters(QStringList *__return_storage_ptr__,QString *nameFilter,QChar sep)

{
  long in_FS_OFFSET;
  iterator __begin1;
  QStringView local_c0;
  QArrayDataPointer<char16_t> local_b0;
  QStringView local_98;
  undefined1 local_88 [32];
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  QStringTokenizerBase<QStringView,_QChar> local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (sep.ucs == L'\0') {
    sep = getFilterSepChar(nameFilter);
  }
  (__return_storage_ptr__->d).size = 0;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QString *)0x0;
  local_50.m_haystack.m_data = (nameFilter->d).ptr;
  local_50.m_haystack.m_size = (nameFilter->d).size;
  local_50.super_QStringTokenizerBaseBase.m_sb.super_QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>.
  super_QFlagsStorage<Qt::SplitBehaviorFlags>.i =
       (QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>)0x0;
  local_50.super_QStringTokenizerBaseBase.m_cs = CaseSensitive;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  local_88._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_88._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_88._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_88._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_50.m_needle.ucs = sep.ucs;
  QStringTokenizerBase<QStringView,_QChar>::iterator::iterator((iterator *)local_88,&local_50);
  while (local_88[0x18] != false) {
    local_98.m_size = local_88._8_8_;
    local_98.m_data = (storage_type_conflict *)local_88._16_8_;
    local_c0 = QStringView::trimmed(&local_98);
    QStringView::toString((QString *)&local_b0,&local_c0);
    QList<QString>::emplaceBack<QString>(__return_storage_ptr__,(QString *)&local_b0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b0);
    QStringTokenizerBase<QStringView,_QChar>::iterator::advance((iterator *)local_88);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

inline QStringList QDirPrivate::splitFilters(const QString &nameFilter, QChar sep)
{
    if (sep.isNull())
        sep = getFilterSepChar(nameFilter);
    QStringList ret;
    for (auto e : qTokenize(nameFilter, sep))
        ret.append(e.trimmed().toString());
    return ret;
}